

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seqdiff.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer plVar1;
  unsigned_long *puVar2;
  unsigned_long uVar3;
  double dVar4;
  double dVar5;
  FILE *__stream;
  pointer pbVar6;
  int iVar7;
  ostream *poVar8;
  sequence_gap_structure *sequence_descriptor1;
  char *pcVar9;
  Vector *pVVar10;
  char *s2;
  pointer *pplVar11;
  long lVar12;
  sequence_gap_structure *psVar13;
  char matchMode;
  int iVar14;
  unsigned_long sid;
  pointer pvVar15;
  unsigned_long *puVar16;
  type value;
  bool bVar17;
  pointer pbVar18;
  pointer plVar19;
  ulong idx;
  pair<std::_Rb_tree_iterator<std::pair<Vector_*const,_long>_>,_bool> pVar20;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_bool>
  pVar21;
  char automatonState;
  pointer local_208;
  pointer *local_200;
  long firstSequenceLength;
  args_t args;
  Vector *differences;
  size_type local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  long my_code;
  pointer pbStack_190;
  pointer local_188;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  copies;
  time_t after;
  time_t before;
  char *local_148;
  double dStack_140;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  local_130;
  vector<long,_std::allocator<long>_> new_vector;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  recoded_patterns;
  vector<Vector_*,_std::allocator<Vector_*>_> patterns;
  vector<long,_std::allocator<long>_> assignments;
  map<Vector_*,_long,_cmpMatchPatterns,_std::allocator<std::pair<Vector_*const,_long>_>_>
  pattern_map;
  vector<long,_std::allocator<long>_> recoded;
  
  argparse::args_t::args_t(&args,argc,argv);
  firstSequenceLength = 0;
  automatonState = '\0';
  Vector::appendValue(&nameLengths,0);
  Vector::appendValue(&seqLengths,0);
  initAlphabets(false,(char *)0x0,false);
  iVar7 = readFASTA(args.reference,&automatonState,&names,&sequences,&nameLengths,&seqLengths,
                    &firstSequenceLength,false,(Vector *)0x0,':',1.0,false);
  iVar14 = 1;
  if (iVar7 != 1) {
    automatonState = '\0';
    iVar7 = readFASTA(args.input,&automatonState,&names,&sequences,&nameLengths,&seqLengths,
                      &firstSequenceLength,false,(Vector *)0x0,':',1.0,(bool)(args.quiet ^ 1));
    uVar3 = seqLengths.vLength;
    if (iVar7 != 1) {
      if (args.quiet == false) {
        poVar8 = std::operator<<((ostream *)&std::cerr,"Read ");
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        poVar8 = std::operator<<(poVar8," sequences of length ");
        poVar8 = std::ostream::_M_insert<long>((long)poVar8);
        poVar8 = std::operator<<(poVar8,"nt from input file ");
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      pvVar15 = (pointer)(uVar3 - 1);
      local_200 = (pointer *)pvVar15;
      sequence_descriptor1 =
           (sequence_gap_structure *)
           operator_new__(-(ulong)((ulong)pvVar15 >> 0x3b != 0) | (long)pvVar15 * 0x20);
      if ((pointer)local_200 != (pointer)0x0) {
        psVar13 = sequence_descriptor1;
        do {
          psVar13->first_nongap = 0x7fffffffffffffff;
          psVar13->resolved_end = 0;
          psVar13->last_nongap = 0;
          psVar13->resolved_start = 0;
          psVar13 = psVar13 + 1;
        } while (psVar13 != sequence_descriptor1 + (long)pvVar15);
      }
      psVar13 = sequence_descriptor1;
      for (pvVar15 = (pointer)0x0; (pointer)local_200 != pvVar15;
          pvVar15 = (pointer)((long)&(pvVar15->super__Vector_base<long,_std::allocator<long>_>).
                                     _M_impl.super__Vector_impl_data._M_start + 1)) {
        pcVar9 = stringText(&sequences,&seqLengths,(unsigned_long)pvVar15);
        describe_sequence((sequence_gap_structure *)&pattern_map,pcVar9,firstSequenceLength,4);
        psVar13->resolved_start =
             (long)pattern_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        psVar13->resolved_end =
             (long)pattern_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        psVar13->first_nongap = pattern_map._M_t._M_impl._0_8_;
        psVar13->last_nongap =
             CONCAT44(pattern_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                      pattern_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
        psVar13 = psVar13 + 1;
      }
      if (args.quiet == false) {
        poVar8 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        std::operator<<(poVar8,"Progress: ");
      }
      matchMode = '\x06';
      if (args.ambig != informative) {
        matchMode = (args.ambig == all) * '\x05';
      }
      time(&before);
      stringText(&names,&nameLengths,0);
      pcVar9 = stringText(&sequences,&seqLengths,0);
      pattern_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &pattern_map._M_t._M_impl.super__Rb_tree_header._M_header;
      pattern_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      pattern_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      pattern_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      assignments.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      copies.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      copies.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      copies.
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      dStack_140 = (double)CONCAT44(0x45300000,(int)((ulong)local_200 >> 0x20)) -
                   1.9342813113834067e+25;
      local_148 = (char *)(dStack_140 +
                          ((double)CONCAT44(0x43300000,(int)local_200) - 4503599627370496.0));
      local_208 = (pointer)0x0;
      pattern_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           pattern_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (local_130.first._M_dataplus._M_p = (pointer)0x1;
          local_130.first._M_dataplus._M_p < local_200;
          local_130.first._M_dataplus._M_p = local_130.first._M_dataplus._M_p + 1) {
        if ((args.quiet == false) &&
           (((pointer)local_130.first._M_dataplus._M_p == (pointer)(uVar3 - 2) ||
            (0.1 < ((double)(long)local_130.first._M_dataplus._M_p * 100.0) / (double)local_148 -
                   (double)local_208)))) {
          time(&after);
          local_208 = (pointer)((double)(long)local_130.first._M_dataplus._M_p * 100.0);
          poVar8 = std::operator<<((ostream *)&std::cerr,
                                   "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress:"
                                  );
          local_208 = (pointer)((double)local_208 / (double)local_148);
          *(undefined8 *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) = 8;
          poVar8 = std::ostream::_M_insert<double>((double)local_208);
          poVar8 = std::operator<<(poVar8,"% (");
          lVar12 = *(long *)poVar8;
          *(undefined8 *)(poVar8 + *(long *)(lVar12 + -0x18) + 0x10) = 0xc;
          *(undefined8 *)(poVar8 + *(long *)(lVar12 + -0x18) + 8) = 3;
          dVar4 = (double)(long)local_130.first._M_dataplus._M_p;
          dVar5 = difftime(after,before);
          poVar8 = std::ostream::_M_insert<double>(dVar4 / dVar5);
          std::operator<<(poVar8," seqs/sec)");
          after = before;
        }
        pVVar10 = (Vector *)operator_new(0x18);
        Vector::Vector(pVVar10);
        differences = pVVar10;
        s2 = stringText(&sequences,&seqLengths,(unsigned_long)local_130.first._M_dataplus._M_p);
        computeDifferences(pcVar9,s2,firstSequenceLength,matchMode,differences,sequence_descriptor1,
                           sequence_descriptor1 + (long)local_130.first._M_dataplus._M_p);
        new_vector.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)differences;
        new_vector.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)pattern_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
        pVar20 = std::
                 _Rb_tree<Vector*,std::pair<Vector*const,long>,std::_Select1st<std::pair<Vector*const,long>>,cmpMatchPatterns,std::allocator<std::pair<Vector*const,long>>>
                 ::_M_insert_unique<std::pair<Vector*const,long>>
                           ((_Rb_tree<Vector*,std::pair<Vector*const,long>,std::_Select1st<std::pair<Vector*const,long>>,cmpMatchPatterns,std::allocator<std::pair<Vector*const,long>>>
                             *)&pattern_map,(pair<Vector_*const,_long> *)&new_vector);
        if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          my_code = (long)pVar20.first._M_node._M_node[1]._M_parent;
          std::vector<long,_std::allocator<long>_>::push_back(&assignments,&my_code);
          pVVar10 = differences;
          if (differences != (Vector *)0x0) {
            Vector::~Vector(differences);
          }
          operator_delete(pVVar10,0x18);
        }
        else {
          my_code = pattern_map._M_t._M_impl.super__Rb_tree_header._M_node_count - 1;
          new_vector.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)my_code;
          std::vector<long,_std::allocator<long>_>::emplace_back<long>
                    (&assignments,(long *)&new_vector);
          std::vector<Vector_*,_std::allocator<Vector_*>_>::push_back(&patterns,&differences);
        }
        if ((ulong)(((long)copies.
                           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)copies.
                          super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= (ulong)my_code) {
          new_vector.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)0x0;
          new_vector.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)0x0;
          new_vector.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::push_back(&copies,(value_type *)&new_vector);
          std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                    ((_Vector_base<long,_std::allocator<long>_> *)&new_vector);
        }
        std::vector<long,_std::allocator<long>_>::push_back
                  (copies.
                   super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + my_code,
                   (value_type_conflict1 *)&local_130);
      }
      if ((args.out_format == json) && (args.compress == true)) {
        new_vector.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((ulong)new_vector.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000)
        ;
        new_vector.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        my_code = 0;
        pbStack_190 = (pointer)0x0;
        local_188 = (pointer)0x0;
        recoded_patterns.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        recoded_patterns.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        recoded_patterns.
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_208 = (pointer)patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
        pplVar11 = (pointer *)
                   patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_148 = pcVar9;
        while ((pointer)pplVar11 != local_208) {
          pVVar10 = (Vector *)*pplVar11;
          recoded.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          recoded.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          recoded.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_200 = pplVar11;
          for (idx = 0; idx < pVVar10->vLength; idx = idx + 1) {
            differences = (Vector *)&local_1a8;
            local_1b0 = 0;
            local_1a8._M_local_buf[0] = '\0';
            lVar12 = Vector::value(pVVar10,idx);
            std::__cxx11::to_string(&local_130.first,(lVar12 >> 8) + 1);
            std::__cxx11::string::append((string *)&differences);
            std::__cxx11::string::~string((string *)&local_130);
            unmap_char((uchar)lVar12,false);
            std::__cxx11::string::push_back((char)&differences);
            std::__cxx11::string::string((string *)&local_130,(string *)&differences);
            local_130.second = 0;
            pVar21 = std::
                     _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                     ::_M_insert_unique<std::pair<std::__cxx11::string_const,long>>
                               ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::_Select1st<std::pair<std::__cxx11::string_const,long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long>>>
                                 *)&new_vector,&local_130);
            std::__cxx11::string::~string((string *)&local_130);
            if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              local_130.first._M_dataplus._M_p = *(pointer *)(pVar21.first._M_node._M_node + 2);
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&my_code,(value_type *)&differences);
              local_130.first._M_dataplus._M_p = (pointer)0xffffffffffffffff;
            }
            std::vector<long,_std::allocator<long>_>::push_back
                      ((vector<long,_std::allocator<long>_> *)
                       &recoded.super__Vector_base<long,_std::allocator<long>_>,
                       (value_type_conflict1 *)&local_130);
            std::__cxx11::string::~string((string *)&differences);
          }
          std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::push_back(&recoded_patterns,
                      (value_type *)&recoded.super__Vector_base<long,_std::allocator<long>_>);
          std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                    (&recoded.super__Vector_base<long,_std::allocator<long>_>);
          pplVar11 = local_200 + 1;
        }
        fwrite("{\"reference\":\"",0xe,1,(FILE *)args.output);
        dump_fasta(local_148,firstSequenceLength,args.output,false,false,0,0);
        fwrite("\",\"mutations\" : [",0x11,1,(FILE *)args.output);
        pbVar18 = (pointer)my_code;
        fprintf((FILE *)args.output,"\"%s\"",*(undefined8 *)my_code);
        pbVar6 = pbStack_190;
        while( true ) {
          pbVar18 = pbVar18 + 1;
          if (pbVar18 == pbVar6) break;
          fprintf((FILE *)args.output,",\"%s\"",(pbVar18->_M_dataplus)._M_p);
        }
        fwrite("], \"patterns\" : [",0x11,1,(FILE *)args.output);
        local_208 = recoded_patterns.
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        bVar17 = false;
        pvVar15 = recoded_patterns.
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        while (pvVar15 != local_208) {
          if (bVar17) {
            fputc(0x2c,(FILE *)args.output);
          }
          fputc(0x5b,(FILE *)args.output);
          plVar1 = (pvVar15->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          bVar17 = true;
          local_200 = (pointer *)pvVar15;
          for (plVar19 = (pvVar15->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                         super__Vector_impl_data._M_start; plVar19 != plVar1; plVar19 = plVar19 + 1)
          {
            lVar12 = *plVar19;
            if (!bVar17) {
              fputc(0x2c,(FILE *)args.output);
            }
            bVar17 = false;
            fprintf((FILE *)args.output,"%ld",lVar12);
          }
          fputc(0x5d,(FILE *)args.output);
          bVar17 = true;
          pvVar15 = (pointer)((long)local_200 + 0x18);
        }
        fwrite("], \"sequences\" : [",0x12,1,(FILE *)args.output);
        local_208 = copies.
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        bVar17 = false;
        pvVar15 = copies.
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        while (pvVar15 != local_208) {
          if (bVar17) {
            fputc(0x2c,(FILE *)args.output);
          }
          fputc(0x5b,(FILE *)args.output);
          puVar2 = (unsigned_long *)
                   (pvVar15->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          bVar17 = true;
          local_200 = (pointer *)pvVar15;
          for (puVar16 = (unsigned_long *)
                         (pvVar15->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                         super__Vector_impl_data._M_start; puVar16 != puVar2; puVar16 = puVar16 + 1)
          {
            uVar3 = *puVar16;
            if (!bVar17) {
              fputc(0x2c,(FILE *)args.output);
            }
            __stream = args.output;
            pcVar9 = stringText(&names,&nameLengths,uVar3);
            bVar17 = false;
            fprintf((FILE *)__stream,"\"%s\"",pcVar9);
          }
          fputc(0x5d,(FILE *)args.output);
          bVar17 = true;
          pvVar15 = (pointer)((long)local_200 + 0x18);
        }
        fwrite("]}",2,1,(FILE *)args.output);
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::~vector(&recoded_patterns);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&my_code);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                     *)&new_vector);
      }
      operator_delete__(sequence_descriptor1);
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::~vector(&copies);
      std::_Vector_base<Vector_*,_std::allocator<Vector_*>_>::~_Vector_base
                (&patterns.super__Vector_base<Vector_*,_std::allocator<Vector_*>_>);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
                (&assignments.super__Vector_base<long,_std::allocator<long>_>);
      std::
      _Rb_tree<Vector_*,_std::pair<Vector_*const,_long>,_std::_Select1st<std::pair<Vector_*const,_long>_>,_cmpMatchPatterns,_std::allocator<std::pair<Vector_*const,_long>_>_>
      ::~_Rb_tree(&pattern_map._M_t);
      iVar14 = 0;
    }
  }
  argparse::args_t::~args_t(&args);
  return iVar14;
}

Assistant:

int main(int argc, const char *argv[]) {
  args_t args = args_t(argc, argv);

  long firstSequenceLength = 0;

  char automatonState = 0;
  // 0 - between sequences
  // 1 - reading sequence name
  // 2 - reading sequence

  nameLengths.appendValue(0);
  seqLengths.appendValue(0);

  initAlphabets(false, NULL);
  if (readFASTA(args.reference, automatonState, names, sequences, nameLengths,
                  seqLengths, firstSequenceLength) == 1)
    return 1;
    
  automatonState = 0;
    
    
  if (readFASTA(args.input, automatonState, names, sequences, nameLengths,
                seqLengths, firstSequenceLength, false, NULL, ':', 1.0, !args.quiet) == 1)
    return 1;

  unsigned long sequenceCount = seqLengths.length() - 1;

  if (!args.quiet) {
      cerr << "Read " << sequenceCount - 1 << " sequences of length " << firstSequenceLength <<"nt from input file " << endl;
  }

  sequence_gap_structure *sequence_descriptors = NULL;

  double percentDone = 0.;

  sequence_descriptors = new sequence_gap_structure[sequenceCount];
  for (unsigned long sid = 0UL; sid < sequenceCount; sid++) {
    sequence_descriptors[sid] = describe_sequence(
        stringText(sequences, seqLengths, sid), firstSequenceLength);
  }

  if (!args.quiet)
    cerr << endl << "Progress: ";

  int resolutionOption;
  switch (args.ambig) {
  case resolve:
    resolutionOption = RESOLVE;
    break;
  case all:
    resolutionOption = MISMATCH;
    break;
  case informative:
    resolutionOption = INFORMATIVE;
    break;
  }

  time_t before, after;
  time(&before);

  const char *ref_name = stringText(names, nameLengths, 0),
             *ref_seq = stringText(sequences, seqLengths, 0);
    
  const sequence_gap_structure *ref_gaps = &sequence_descriptors[0];
    
  std::map <Vector*, long, cmpMatchPatterns> pattern_map;
  std::vector <long> assignments;
  std::vector <Vector*> patterns;
  std::vector <std::vector<long>> copies;
    
    
  for (long seq_id = 1L; seq_id < sequenceCount; seq_id ++) {
      
      if (!args.quiet && (seq_id * 100. / sequenceCount - percentDone > 0.1 ||
                          seq_id == (long)sequenceCount - 1)) {
        {
          time(&after);
          percentDone = seq_id * 100. / sequenceCount;
          cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                  "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                  "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress"
                  ":"
               << setw(8) << percentDone << "% (" << setw(12) << std::setprecision(3)
               << seq_id / difftime(after, before) << " seqs/sec)";

          after = before;
        }
      }
      
      Vector* differences = new Vector;
      const char *seq_data = stringText(sequences, seqLengths, seq_id);

      computeDifferences(ref_seq, seq_data, firstSequenceLength, resolutionOption, *differences, ref_gaps, &sequence_descriptors[seq_id]);
      
      auto intert_result = pattern_map.insert({differences, pattern_map.size()});
      bool did_insert = std::get<1>(intert_result);
      long my_code;
      if (!did_insert) {
          auto value = std::get<0>(intert_result);
          my_code = std::get<1>(*value);
          assignments.push_back(my_code);
          delete differences;
      } else {
          my_code = pattern_map.size()-1;
          assignments.push_back(pattern_map.size()-1);
          patterns.push_back (differences);
      }
      if (my_code >= copies.size()) {
          std::vector<long> new_vector;
          copies.push_back (new_vector);
      }
      copies[my_code].push_back(seq_id);
  }
    
  
    
  if (args.out_format == json) {
      if (args.compress) {
          std::map <std::string, long> differences_map;
          std::vector <std::string> unique_differences;
          std::vector <std::vector<long>> recoded_patterns;
          
          for (Vector* p : patterns) {
              std::vector <long> recoded;
              for (long i = 0; i < p->length(); i++) {
                  std::string mut;
                  long     position;
                  unsigned character;
                  unpack_difference(p->value (i), position, character);
                  mut += to_string(position+1);
                  mut += unmap_char(character);
                  auto intert_result = differences_map.insert({mut, differences_map.size()});
                  bool did_insert = std::get<1>(intert_result);
                  long index;
                  if (did_insert) {
                      unique_differences.push_back (mut);
                      //cout << mut << endl;
                      index = differences_map.size() - 1;
                  } else {
                      auto value = std::get<0>(intert_result);
                      index = std::get<1>(*value);
                  }
                  recoded.push_back (index);
              }
              recoded_patterns.push_back (recoded);
          }
          
          // write out mutational codes
          fprintf (args.output, "{\"reference\":\"");
          dump_fasta (ref_seq, firstSequenceLength, args.output, false, false,0L,0L);
          fprintf (args.output, "\",\"mutations\" : [");
          auto mutation_string = unique_differences.begin();
          fprintf (args.output, "\"%s\"", (*mutation_string).c_str());
          mutation_string ++;
          std::for_each(mutation_string, unique_differences.end(), [&](const std::string& s) {fprintf (args.output,",\"%s\"",s.c_str()); });
          fprintf (args.output, "], \"patterns\" : [");
          bool comma = false;
          std::for_each(recoded_patterns.begin(), recoded_patterns.end(),[&](const std::vector<long>& pattern) {
              if (comma) fprintf (args.output, ",");
              long comma_inner = false;
              fprintf (args.output, "[");
              std::for_each(pattern.begin(), pattern.end(), [&](const long mi) {
                  if (comma_inner) fprintf (args.output, ",");
                  fprintf (args.output, "%ld", mi);
                  comma_inner = true;
              });
              fprintf (args.output, "]");
              comma = true;
          });
          fprintf (args.output, "], \"sequences\" : [");
          comma = false;
          std::for_each(copies.begin(), copies.end(),[&](const std::vector<long>& pattern) {
              if (comma) fprintf (args.output, ",");
              long comma_inner = false;
              fprintf (args.output, "[");
              std::for_each(pattern.begin(), pattern.end(), [&](const long mi) {
                  if (comma_inner) fprintf (args.output, ",");
                  fprintf (args.output, "\"%s\"", stringText(names, nameLengths, mi));
                  comma_inner = true;
              });
              fprintf (args.output, "]");
              comma = true;
          });
          fprintf (args.output, "]}");
      }
      
      /*for (std::vector<long> c: copies ) {
          cout << c.size() << endl;
      }*/
      
      
  }
    
  delete [] sequence_descriptors;
  return 0;
}